

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O2

void anon_unknown.dwarf_233e16::writeRead
               (Array2D<unsigned_int> *pi1,Array2D<half> *ph1,Array2D<float> *pf1,char *fileName,
               LineOrder lorder,int width,int height,int xSize,int ySize,int xOffset,int yOffset,
               Compression comp,LevelMode mode,LevelRoundingMode rmode)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  LineOrder LVar4;
  Compression CVar5;
  bool ytc;
  bool bVar6;
  bool ytc_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ostream *poVar13;
  LineOrder *pLVar14;
  Compression *pCVar15;
  ChannelList *pCVar16;
  Header *pHVar17;
  Box2i *pBVar18;
  Box2i *pBVar19;
  float *pfVar20;
  V2f *pVVar21;
  V2f *pVVar22;
  iterator iVar23;
  const_iterator cVar24;
  Iterator IVar25;
  ConstIterator CVar26;
  long lVar27;
  long lVar28;
  uint *puVar29;
  long lVar30;
  int tileY_1;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  int tileY;
  uint uVar34;
  uint dy;
  long lVar35;
  uint *puVar36;
  half *phVar37;
  undefined1 uVar38;
  undefined8 in_R10;
  half *phVar39;
  int tileY_2;
  int dy_00;
  long lVar40;
  int tileX;
  long lVar41;
  int level;
  ulong uVar42;
  int tileX_1;
  int iVar43;
  float *pfVar44;
  InputFile in;
  int local_158;
  int local_150;
  Array2D<unsigned_int> pi2;
  FrameBuffer fb;
  Array2D<float> pf2;
  Array2D<half> ph2;
  TiledOutputFile out;
  Header hdr;
  int local_38;
  
  poVar13 = std::operator<<((ostream *)&std::cout,"levelMode ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,xOffset);
  poVar13 = std::operator<<(poVar13,", roundingMode ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,yOffset);
  poVar13 = std::operator<<(poVar13,", line order ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,lorder);
  poVar13 = std::operator<<(poVar13,",\ntileSize ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,width);
  poVar13 = std::operator<<(poVar13,"x");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,height);
  poVar13 = std::operator<<(poVar13,", xOffset ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,xSize);
  poVar13 = std::operator<<(poVar13,", yOffset ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,ySize);
  std::endl<char,std::char_traits<char>>(poVar13);
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  out._data = (Data *)0x500000002f;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = xSize + 0x2f;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = ySize + 0x50;
  fb._map._M_t._M_impl._0_4_ = xSize;
  fb._map._M_t._M_impl._4_4_ = ySize;
  pi2._sizeX = 0;
  Imf_2_5::Header::Header
            (&hdr,(Box2i *)&out,(Box2i *)&fb,1.0,(V2f *)&pi2,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pLVar14 = Imf_2_5::Header::lineOrder(&hdr);
  *pLVar14 = lorder;
  pCVar15 = Imf_2_5::Header::compression(&hdr);
  *pCVar15 = ZIP_COMPRESSION;
  pCVar16 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,UINT,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar16,"I",(Channel *)&out);
  pCVar16 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar16,"H",(Channel *)&out);
  pCVar16 = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_2_5::ChannelList::insert(pCVar16,"F",(Channel *)&out);
  out.super_GenericOutputFile._vptr_GenericOutputFile._4_4_ = height;
  out.super_GenericOutputFile._vptr_GenericOutputFile._0_4_ = width;
  out._data = (Data *)CONCAT44(yOffset,xOffset);
  Imf_2_5::Header::setTileDescription(&hdr,(TileDescription *)&out);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar33 = (ulong)(uint)-ySize;
  uVar42 = (ulong)(uint)-xSize;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            ((Slice *)&out,UINT,(char *)(pi1->_data + pi1->_sizeY * uVar33 + uVar42),4,0xc0,1,1,0.0,
             SUB81(in_R10,0),SUB81(pi1->_data + pi1->_sizeY * uVar33,0));
  Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,HALF,(char *)(ph1->_data + ph1->_sizeY * uVar33 + uVar42),2,0x60,1,1,0.0,
             SUB81(in_R10,0),SUB81(ph1->_data + ph1->_sizeY * uVar33,0));
  Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,FLOAT,(char *)(pf1->_data + uVar33 * pf1->_sizeY + uVar42),4,0xc0,1,1,0.0
             ,SUB81(in_R10,0),SUB81(pf1,0));
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::operator<<((ostream *)&std::cout," writing");
  std::ostream::flush();
  remove(fileName);
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledOutputFile::TiledOutputFile(&out,fileName,&hdr,iVar7);
  Imf_2_5::TiledOutputFile::setFrameBuffer(&out,&fb);
  if (xOffset == 0) {
    if (lorder == DECREASING_Y) {
      iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      iVar8 = iVar8 + -1;
      iVar10 = -1;
      iVar7 = iVar10;
    }
    else {
      iVar8 = 0;
      iVar10 = Imf_2_5::TiledOutputFile::numYTiles(&out,0);
      iVar7 = 1;
    }
    for (; uVar38 = (undefined1)in_R10, iVar8 != iVar10; iVar8 = iVar8 + iVar7) {
      for (iVar43 = 0; iVar32 = Imf_2_5::TiledOutputFile::numXTiles(&out,0), iVar43 < iVar32;
          iVar43 = iVar43 + 1) {
        Imf_2_5::TiledOutputFile::writeTile(&out,iVar43,iVar8,0);
      }
    }
  }
  else if (xOffset == 1) {
    uVar34 = -(uint)(lorder == DECREASING_Y);
    uVar31 = uVar34 | 1;
    uVar9 = 0xffffffff;
    iVar7 = 0;
    while( true ) {
      iVar8 = Imf_2_5::TiledOutputFile::numLevels(&out);
      uVar38 = (undefined1)in_R10;
      if (iVar8 <= iVar7) break;
      if (lorder == DECREASING_Y) {
        iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        uVar34 = iVar8 - 1;
        dy = uVar34;
      }
      else {
        uVar9 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        dy = uVar34;
      }
      for (; dy != uVar9; dy = dy + uVar31) {
        for (iVar8 = 0; iVar10 = Imf_2_5::TiledOutputFile::numXTiles(&out,iVar7), iVar8 < iVar10;
            iVar8 = iVar8 + 1) {
          Imf_2_5::TiledOutputFile::writeTile(&out,iVar8,dy,iVar7);
        }
      }
      iVar7 = iVar7 + 1;
    }
  }
  else {
    iVar7 = 0;
    while( true ) {
      iVar8 = Imf_2_5::TiledOutputFile::numYLevels(&out);
      uVar38 = (undefined1)in_R10;
      if (iVar8 <= iVar7) break;
      if (lorder == DECREASING_Y) {
        iVar10 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        iVar10 = iVar10 + -1;
        iVar43 = -1;
        iVar8 = iVar43;
      }
      else {
        iVar8 = Imf_2_5::TiledOutputFile::numYTiles(&out,iVar7);
        iVar10 = 0;
        iVar43 = 1;
      }
      for (iVar32 = 0; iVar11 = Imf_2_5::TiledOutputFile::numXLevels(&out), dy_00 = iVar10,
          iVar32 < iVar11; iVar32 = iVar32 + 1) {
        for (; dy_00 != iVar8; dy_00 = dy_00 + iVar43) {
          for (iVar11 = 0; iVar12 = Imf_2_5::TiledOutputFile::numXTiles(&out,iVar32),
              iVar11 < iVar12; iVar11 = iVar11 + 1) {
            Imf_2_5::TiledOutputFile::writeTile(&out,iVar11,dy_00,iVar32,iVar7);
          }
        }
      }
      iVar7 = iVar7 + 1;
    }
  }
  Imf_2_5::TiledOutputFile::~TiledOutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  std::operator<<((ostream *)&std::cout," reading INCREASING_Y");
  std::ostream::flush();
  iVar7 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
  iVar7 = (pBVar18->min).x;
  lVar35 = (long)iVar7;
  lVar28 = (pBVar18->max).x - lVar35;
  lVar27 = lVar28 + 1;
  lVar40 = (long)(pBVar18->min).y;
  lVar41 = (pBVar18->max).y - lVar40;
  lVar30 = lVar41 + 1;
  Imf_2_5::Array2D<unsigned_int>::Array2D(&pi2,lVar30,lVar27);
  Imf_2_5::Array2D<half>::Array2D(&ph2,lVar30,lVar27);
  Imf_2_5::Array2D<float>::Array2D(&pf2,lVar30,lVar27);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar40 = -lVar40;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_2_5::Slice::Slice
            ((Slice *)&out,UINT,(char *)(pi2._data + (pi2._sizeY * lVar40 - lVar35)),4,lVar27 * 4,1,
             1,0.0,(bool)uVar38,(bool)((char)iVar7 * '\x04'));
  Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,HALF,(char *)(ph2._data + ph2._sizeY * lVar40 + -lVar35),2,lVar27 * 2,1,1
             ,0.0,(bool)uVar38,SUB81(ph2._data + ph2._sizeY * lVar40,0));
  Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
  Imf_2_5::Slice::Slice
            ((Slice *)&out,FLOAT,(char *)(pf2._data + (lVar40 * pf2._sizeY - lVar35)),4,lVar27 * 4,1
             ,1,0.0,(bool)uVar38,ytc);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
  for (iVar7 = (pBVar18->min).y; iVar7 <= (pBVar18->max).y; iVar7 = iVar7 + 1) {
    Imf_2_5::InputFile::readPixels(&in,iVar7);
  }
  std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::flush();
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pBVar18 = Imf_2_5::Header::displayWindow(pHVar17);
  pBVar19 = Imf_2_5::Header::displayWindow(&hdr);
  bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
  if (!bVar6) {
    __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x127,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
  pBVar19 = Imf_2_5::Header::dataWindow(&hdr);
  bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
  if (!bVar6) {
    __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x128,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pfVar20 = Imf_2_5::Header::pixelAspectRatio(pHVar17);
  fVar3 = *pfVar20;
  pfVar20 = Imf_2_5::Header::pixelAspectRatio(&hdr);
  if ((fVar3 != *pfVar20) || (NAN(fVar3) || NAN(*pfVar20))) {
    __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x129,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pVVar21 = Imf_2_5::Header::screenWindowCenter(pHVar17);
  pVVar22 = Imf_2_5::Header::screenWindowCenter(&hdr);
  if ((((pVVar21->x != pVVar22->x) || (NAN(pVVar21->x) || NAN(pVVar22->x))) ||
      (pVVar21->y != pVVar22->y)) || (NAN(pVVar21->y) || NAN(pVVar22->y))) {
    __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12a,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pfVar20 = Imf_2_5::Header::screenWindowWidth(pHVar17);
  fVar3 = *pfVar20;
  pfVar20 = Imf_2_5::Header::screenWindowWidth(&hdr);
  if ((fVar3 != *pfVar20) || (NAN(fVar3) || NAN(*pfVar20))) {
    __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,299,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pLVar14 = Imf_2_5::Header::lineOrder(pHVar17);
  LVar4 = *pLVar14;
  pLVar14 = Imf_2_5::Header::lineOrder(&hdr);
  if (LVar4 != *pLVar14) {
    __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,300,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pCVar15 = Imf_2_5::Header::compression(pHVar17);
  CVar5 = *pCVar15;
  pCVar15 = Imf_2_5::Header::compression(&hdr);
  if (CVar5 != *pCVar15) {
    __assert_fail("in.header().compression() == hdr.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                  ,0x12d,
                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                 );
  }
  pCVar16 = Imf_2_5::Header::channels(&hdr);
  iVar23._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
  pHVar17 = Imf_2_5::InputFile::header(&in);
  pCVar16 = Imf_2_5::Header::channels(pHVar17);
  cVar24._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
  while( true ) {
    pCVar16 = Imf_2_5::Header::channels(&hdr);
    IVar25 = Imf_2_5::ChannelList::end(pCVar16);
    if ((iterator)iVar23._M_node == IVar25._i._M_node) {
      pHVar17 = Imf_2_5::InputFile::header(&in);
      pCVar16 = Imf_2_5::Header::channels(pHVar17);
      CVar26 = Imf_2_5::ChannelList::end(pCVar16);
      if ((const_iterator)cVar24._M_node != CVar26._i._M_node) {
        __assert_fail("ii == in.header().channels().end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x13d,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      puVar29 = pi1->_data;
      phVar37 = ph1->_data;
      pfVar20 = pf1->_data;
      local_150 = (int)lVar28;
      puVar36 = pi2._data;
      phVar39 = ph2._data;
      pfVar44 = pf2._data;
      for (lVar27 = 0; lVar27 <= (int)lVar41; lVar27 = lVar27 + 1) {
        lVar30 = 0;
        while (lVar30 <= local_150) {
          if (puVar29[lVar30] != puVar36[lVar30]) {
            __assert_fail("pi1[y][x] == pi2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x143,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar37[lVar30]._h * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar39[lVar30]._h * 4);
          if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
            __assert_fail("ph1[y][x] == ph2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x144,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          pfVar1 = pfVar20 + lVar30;
          pfVar2 = pfVar44 + lVar30;
          lVar30 = lVar30 + 1;
          if ((*pfVar1 != *pfVar2) || (NAN(*pfVar1) || NAN(*pfVar2))) {
            __assert_fail("pf1[y][x] == pf2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x145,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
        }
        pfVar44 = pfVar44 + pf2._sizeY;
        pfVar20 = pfVar20 + pf1->_sizeY;
        phVar39 = phVar39 + ph2._sizeY;
        phVar37 = phVar37 + ph1->_sizeY;
        puVar36 = puVar36 + pi2._sizeY;
        puVar29 = puVar29 + pi1->_sizeY;
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&fb);
      uVar38 = SUB81(phVar39,0);
      Imf_2_5::Array2D<float>::~Array2D(&pf2);
      Imf_2_5::Array2D<half>::~Array2D(&ph2);
      Imf_2_5::Array2D<unsigned_int>::~Array2D(&pi2);
      Imf_2_5::InputFile::~InputFile(&in);
      poVar13 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::operator<<(poVar13,"         reading DECREASING_Y");
      std::ostream::flush();
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
      pHVar17 = Imf_2_5::InputFile::header(&in);
      pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
      iVar7 = (pBVar18->min).x;
      lVar40 = (long)iVar7;
      lVar28 = (pBVar18->max).x - lVar40;
      lVar27 = lVar28 + 1;
      lVar41 = (long)(pBVar18->min).y;
      lVar35 = (pBVar18->max).y - lVar41;
      lVar30 = lVar35 + 1;
      Imf_2_5::Array2D<unsigned_int>::Array2D(&pi2,lVar30,lVar27);
      Imf_2_5::Array2D<half>::Array2D(&ph2,lVar30,lVar27);
      Imf_2_5::Array2D<float>::Array2D(&pf2,lVar30,lVar27);
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar41 = -lVar41;
      fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Slice::Slice
                ((Slice *)&out,UINT,(char *)(pi2._data + (pi2._sizeY * lVar41 - lVar40)),4,
                 lVar27 * 4,1,1,0.0,(bool)uVar38,(bool)((char)iVar7 * '\x04'));
      Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
      Imf_2_5::Slice::Slice
                ((Slice *)&out,HALF,(char *)(ph2._data + ph2._sizeY * lVar41 + -lVar40),2,lVar27 * 2
                 ,1,1,0.0,(bool)uVar38,SUB81(ph2._data + ph2._sizeY * lVar41,0));
      Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
      Imf_2_5::Slice::Slice
                ((Slice *)&out,FLOAT,(char *)(pf2._data + (lVar41 * pf2._sizeY - lVar40)),4,
                 lVar27 * 4,1,1,0.0,(bool)uVar38,ytc_00);
      Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
      Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
      for (iVar7 = (pBVar18->max).y; (pBVar18->min).y <= iVar7; iVar7 = iVar7 + -1) {
        Imf_2_5::InputFile::readPixels(&in,iVar7);
      }
      std::operator<<((ostream *)&std::cout," comparing");
      std::ostream::flush();
      pHVar17 = Imf_2_5::InputFile::header(&in);
      pBVar18 = Imf_2_5::Header::displayWindow(pHVar17);
      pBVar19 = Imf_2_5::Header::displayWindow(&hdr);
      bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
      if (!bVar6) {
        __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x176,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar17 = Imf_2_5::InputFile::header(&in);
      pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
      pBVar19 = Imf_2_5::Header::dataWindow(&hdr);
      bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
      if (!bVar6) {
        __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x177,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      pHVar17 = Imf_2_5::InputFile::header(&in);
      pfVar20 = Imf_2_5::Header::pixelAspectRatio(pHVar17);
      fVar3 = *pfVar20;
      pfVar20 = Imf_2_5::Header::pixelAspectRatio(&hdr);
      if ((fVar3 == *pfVar20) && (!NAN(fVar3) && !NAN(*pfVar20))) {
        pHVar17 = Imf_2_5::InputFile::header(&in);
        pVVar21 = Imf_2_5::Header::screenWindowCenter(pHVar17);
        pVVar22 = Imf_2_5::Header::screenWindowCenter(&hdr);
        if ((((pVVar21->x != pVVar22->x) || (NAN(pVVar21->x) || NAN(pVVar22->x))) ||
            (pVVar21->y != pVVar22->y)) || (NAN(pVVar21->y) || NAN(pVVar22->y))) {
          __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x179,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        pHVar17 = Imf_2_5::InputFile::header(&in);
        pfVar20 = Imf_2_5::Header::screenWindowWidth(pHVar17);
        fVar3 = *pfVar20;
        pfVar20 = Imf_2_5::Header::screenWindowWidth(&hdr);
        if ((fVar3 != *pfVar20) || (NAN(fVar3) || NAN(*pfVar20))) {
          __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x17a,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        pHVar17 = Imf_2_5::InputFile::header(&in);
        pLVar14 = Imf_2_5::Header::lineOrder(pHVar17);
        LVar4 = *pLVar14;
        pLVar14 = Imf_2_5::Header::lineOrder(&hdr);
        if (LVar4 != *pLVar14) {
          __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x17b,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        pHVar17 = Imf_2_5::InputFile::header(&in);
        pCVar15 = Imf_2_5::Header::compression(pHVar17);
        CVar5 = *pCVar15;
        pCVar15 = Imf_2_5::Header::compression(&hdr);
        if (CVar5 != *pCVar15) {
          __assert_fail("in.header().compression() == hdr.compression()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                        ,0x17c,
                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                       );
        }
        pCVar16 = Imf_2_5::Header::channels(&hdr);
        iVar23._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
        pHVar17 = Imf_2_5::InputFile::header(&in);
        pCVar16 = Imf_2_5::Header::channels(pHVar17);
        cVar24._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
        while( true ) {
          pCVar16 = Imf_2_5::Header::channels(&hdr);
          IVar25 = Imf_2_5::ChannelList::end(pCVar16);
          if ((iterator)iVar23._M_node == IVar25._i._M_node) {
            pHVar17 = Imf_2_5::InputFile::header(&in);
            pCVar16 = Imf_2_5::Header::channels(pHVar17);
            CVar26 = Imf_2_5::ChannelList::end(pCVar16);
            if ((const_iterator)cVar24._M_node != CVar26._i._M_node) {
              __assert_fail("ii == in.header().channels().end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x18c,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            puVar29 = pi1->_data;
            phVar37 = ph1->_data;
            pfVar20 = pf1->_data;
            local_150 = (int)lVar28;
            local_158 = (int)lVar35;
            puVar36 = pi2._data;
            phVar39 = ph2._data;
            pfVar44 = pf2._data;
            for (lVar27 = 0; lVar27 <= local_158; lVar27 = lVar27 + 1) {
              lVar30 = 0;
              while (lVar30 <= local_150) {
                if (puVar29[lVar30] != puVar36[lVar30]) {
                  __assert_fail("pi1[y][x] == pi2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x192,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
                fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar37[lVar30]._h * 4);
                pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar39[lVar30]._h * 4);
                if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
                  __assert_fail("ph1[y][x] == ph2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x193,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
                pfVar1 = pfVar20 + lVar30;
                pfVar2 = pfVar44 + lVar30;
                lVar30 = lVar30 + 1;
                if ((*pfVar1 != *pfVar2) || (NAN(*pfVar1) || NAN(*pfVar2))) {
                  __assert_fail("pf1[y][x] == pf2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                ,0x194,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                               );
                }
              }
              pfVar44 = pfVar44 + pf2._sizeY;
              pfVar20 = pfVar20 + pf1->_sizeY;
              phVar39 = phVar39 + ph2._sizeY;
              phVar37 = phVar37 + ph1->_sizeY;
              puVar36 = puVar36 + pi2._sizeY;
              puVar29 = puVar29 + pi1->_sizeY;
            }
            std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                         *)&fb);
            Imf_2_5::Array2D<float>::~Array2D(&pf2);
            Imf_2_5::Array2D<half>::~Array2D(&ph2);
            Imf_2_5::Array2D<unsigned_int>::~Array2D(&pi2);
            Imf_2_5::InputFile::~InputFile(&in);
            poVar13 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::operator<<(poVar13,"         reading INCREASING_Y (new frame buffer on every line)"
                           );
            std::ostream::flush();
            iVar7 = Imf_2_5::globalThreadCount();
            Imf_2_5::InputFile::InputFile(&in,fileName,iVar7);
            pHVar17 = Imf_2_5::InputFile::header(&in);
            pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
            iVar7 = (pBVar18->min).x;
            lVar40 = (long)iVar7;
            lVar35 = (pBVar18->max).x - lVar40;
            lVar27 = lVar35 + 1;
            lVar28 = (long)(pBVar18->min).y;
            lVar41 = (pBVar18->max).y - lVar28;
            lVar30 = lVar41 + 1;
            Imf_2_5::Array2D<unsigned_int>::Array2D(&pi2,lVar30,lVar27);
            Imf_2_5::Array2D<half>::Array2D(&ph2,lVar30,lVar27);
            Imf_2_5::Array2D<float>::Array2D(&pf2,lVar30,lVar27);
            for (lVar27 = (long)(pBVar18->min).y; lVar27 <= (pBVar18->max).y; lVar27 = lVar27 + 1) {
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              lVar30 = lVar27 - lVar28;
              fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,UINT,(char *)(pi2._data + pi2._sizeY * lVar30 + -lVar40),4,0,
                         1,1,0.0,SUB81(phVar39,0),SUB81(pi2._data + pi2._sizeY * lVar30,0));
              Imf_2_5::FrameBuffer::insert(&fb,"I",(Slice *)&out);
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,HALF,(char *)(ph2._data + ph2._sizeY * lVar30 + -lVar40),2,0,
                         1,1,0.0,SUB81(phVar39,0),SUB81(ph2._data + ph2._sizeY * lVar30,0));
              Imf_2_5::FrameBuffer::insert(&fb,"H",(Slice *)&out);
              Imf_2_5::Slice::Slice
                        ((Slice *)&out,FLOAT,(char *)(pf2._data + (lVar30 * pf2._sizeY - lVar40)),4,
                         0,1,1,0.0,SUB81(phVar39,0),(bool)-(char)iVar7);
              Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
              Imf_2_5::InputFile::setFrameBuffer(&in,&fb);
              Imf_2_5::InputFile::readPixels(&in,(int)lVar27);
              std::
              _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                           *)&fb);
            }
            std::operator<<((ostream *)&std::cout," comparing");
            std::ostream::flush();
            pHVar17 = Imf_2_5::InputFile::header(&in);
            pBVar18 = Imf_2_5::Header::displayWindow(pHVar17);
            pBVar19 = Imf_2_5::Header::displayWindow(&hdr);
            bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
            if (!bVar6) {
              __assert_fail("in.header().displayWindow() == hdr.displayWindow()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1c8,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pHVar17 = Imf_2_5::InputFile::header(&in);
            pBVar18 = Imf_2_5::Header::dataWindow(pHVar17);
            pBVar19 = Imf_2_5::Header::dataWindow(&hdr);
            bVar6 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar18,pBVar19);
            if (!bVar6) {
              __assert_fail("in.header().dataWindow() == hdr.dataWindow()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1c9,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            pHVar17 = Imf_2_5::InputFile::header(&in);
            pfVar20 = Imf_2_5::Header::pixelAspectRatio(pHVar17);
            fVar3 = *pfVar20;
            pfVar20 = Imf_2_5::Header::pixelAspectRatio(&hdr);
            if ((fVar3 == *pfVar20) && (!NAN(fVar3) && !NAN(*pfVar20))) {
              pHVar17 = Imf_2_5::InputFile::header(&in);
              pVVar21 = Imf_2_5::Header::screenWindowCenter(pHVar17);
              pVVar22 = Imf_2_5::Header::screenWindowCenter(&hdr);
              if ((((pVVar21->x != pVVar22->x) || (NAN(pVVar21->x) || NAN(pVVar22->x))) ||
                  (pVVar21->y != pVVar22->y)) || (NAN(pVVar21->y) || NAN(pVVar22->y))) {
                __assert_fail("in.header().screenWindowCenter() == hdr.screenWindowCenter()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x1cb,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              pHVar17 = Imf_2_5::InputFile::header(&in);
              pfVar20 = Imf_2_5::Header::screenWindowWidth(pHVar17);
              fVar3 = *pfVar20;
              pfVar20 = Imf_2_5::Header::screenWindowWidth(&hdr);
              if ((fVar3 != *pfVar20) || (NAN(fVar3) || NAN(*pfVar20))) {
                __assert_fail("in.header().screenWindowWidth() == hdr.screenWindowWidth()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x1cc,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              pHVar17 = Imf_2_5::InputFile::header(&in);
              pLVar14 = Imf_2_5::Header::lineOrder(pHVar17);
              LVar4 = *pLVar14;
              pLVar14 = Imf_2_5::Header::lineOrder(&hdr);
              if (LVar4 != *pLVar14) {
                __assert_fail("in.header().lineOrder() == hdr.lineOrder()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x1cd,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              pHVar17 = Imf_2_5::InputFile::header(&in);
              pCVar15 = Imf_2_5::Header::compression(pHVar17);
              CVar5 = *pCVar15;
              pCVar15 = Imf_2_5::Header::compression(&hdr);
              if (CVar5 == *pCVar15) {
                pCVar16 = Imf_2_5::Header::channels(&hdr);
                iVar23._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
                pHVar17 = Imf_2_5::InputFile::header(&in);
                pCVar16 = Imf_2_5::Header::channels(pHVar17);
                cVar24._M_node = (_Base_ptr)Imf_2_5::ChannelList::begin(pCVar16);
                while( true ) {
                  pCVar16 = Imf_2_5::Header::channels(&hdr);
                  IVar25 = Imf_2_5::ChannelList::end(pCVar16);
                  if ((iterator)iVar23._M_node == IVar25._i._M_node) {
                    pHVar17 = Imf_2_5::InputFile::header(&in);
                    pCVar16 = Imf_2_5::Header::channels(pHVar17);
                    CVar26 = Imf_2_5::ChannelList::end(pCVar16);
                    if ((const_iterator)cVar24._M_node != CVar26._i._M_node) {
                      __assert_fail("ii == in.header().channels().end()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                    ,0x1de,
                                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                   );
                    }
                    puVar29 = pi1->_data;
                    phVar37 = ph1->_data;
                    pfVar20 = pf1->_data;
                    local_158 = (int)lVar35;
                    local_38 = (int)lVar41;
                    lVar27 = 0;
                    do {
                      if (local_38 < lVar27) {
                        Imf_2_5::Array2D<float>::~Array2D(&pf2);
                        Imf_2_5::Array2D<half>::~Array2D(&ph2);
                        Imf_2_5::Array2D<unsigned_int>::~Array2D(&pi2);
                        Imf_2_5::InputFile::~InputFile(&in);
                        remove(fileName);
                        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                        Imf_2_5::Header::~Header(&hdr);
                        return;
                      }
                      lVar30 = 0;
                      while (lVar30 <= local_158) {
                        if (puVar29[lVar30] != pi2._data[lVar30]) {
                          __assert_fail("pi1[y][x] == pi2[y][x]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                        ,0x1e4,
                                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                       );
                        }
                        fVar3 = *(float *)((long)&half::_toFloat + (ulong)phVar37[lVar30]._h * 4);
                        pfVar44 = (float *)((long)&half::_toFloat + (ulong)ph2._data[lVar30]._h * 4)
                        ;
                        if ((fVar3 != *pfVar44) || (NAN(fVar3) || NAN(*pfVar44))) {
                          __assert_fail("ph1[y][x] == ph2[y][x]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                        ,0x1e5,
                                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                       );
                        }
                        pfVar44 = pfVar20 + lVar30;
                        pfVar1 = pf2._data + lVar30;
                        lVar30 = lVar30 + 1;
                        if ((*pfVar44 != *pfVar1) || (NAN(*pfVar44) || NAN(*pfVar1))) {
                          __assert_fail("pf1[y][x] == pf2[y][x]",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                        ,0x1e6,
                                        "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                       );
                        }
                      }
                      lVar27 = lVar27 + 1;
                      pf2._data = pf2._data + pf2._sizeY;
                      pfVar20 = pfVar20 + pf1->_sizeY;
                      ph2._data = ph2._data + ph2._sizeY;
                      phVar37 = phVar37 + ph1->_sizeY;
                      pi2._data = pi2._data + pi2._sizeY;
                      puVar29 = puVar29 + pi1->_sizeY;
                    } while( true );
                  }
                  iVar7 = strcmp((char *)(iVar23._M_node + 1),(char *)(cVar24._M_node + 1));
                  if (iVar7 != 0) {
                    __assert_fail("!strcmp (hi.name(), ii.name())",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x1d5,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  if (iVar23._M_node[9]._M_color != cVar24._M_node[9]._M_color) break;
                  if (*(int *)&iVar23._M_node[9].field_0x4 != *(int *)&cVar24._M_node[9].field_0x4)
                  {
                    __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x1d7,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  if (*(int *)&iVar23._M_node[9]._M_parent != *(int *)&cVar24._M_node[9]._M_parent)
                  {
                    __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                                  ,0x1d8,
                                  "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                                 );
                  }
                  iVar23._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar23._M_node);
                  cVar24._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar24._M_node);
                }
                __assert_fail("hi.channel().type == ii.channel().type",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                              ,0x1d6,
                              "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                             );
              }
              __assert_fail("in.header().compression() == hdr.compression()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                            ,0x1ce,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                           );
            }
            __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x1ca,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          iVar7 = strcmp((char *)(iVar23._M_node + 1),(char *)(cVar24._M_node + 1));
          if (iVar7 != 0) {
            __assert_fail("!strcmp (hi.name(), ii.name())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x183,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          if (iVar23._M_node[9]._M_color != cVar24._M_node[9]._M_color) {
            __assert_fail("hi.channel().type == ii.channel().type",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x184,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          if (*(int *)&iVar23._M_node[9].field_0x4 != *(int *)&cVar24._M_node[9].field_0x4) {
            __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                          ,0x185,
                          "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                         );
          }
          if (*(int *)&iVar23._M_node[9]._M_parent != *(int *)&cVar24._M_node[9]._M_parent) break;
          iVar23._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar23._M_node);
          cVar24._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar24._M_node);
        }
        __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                      ,0x186,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                     );
      }
      __assert_fail("in.header().pixelAspectRatio() == hdr.pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x178,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    iVar7 = strcmp((char *)(iVar23._M_node + 1),(char *)(cVar24._M_node + 1));
    if (iVar7 != 0) {
      __assert_fail("!strcmp (hi.name(), ii.name())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x134,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (iVar23._M_node[9]._M_color != cVar24._M_node[9]._M_color) {
      __assert_fail("hi.channel().type == ii.channel().type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x135,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (*(int *)&iVar23._M_node[9].field_0x4 != *(int *)&cVar24._M_node[9].field_0x4) {
      __assert_fail("hi.channel().xSampling == ii.channel().xSampling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                    ,0x136,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
                   );
    }
    if (*(int *)&iVar23._M_node[9]._M_parent != *(int *)&cVar24._M_node[9]._M_parent) break;
    iVar23._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar23._M_node);
    cVar24._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar24._M_node);
  }
  __assert_fail("hi.channel().ySampling == ii.channel().ySampling",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testScanLineApi.cpp"
                ,0x137,
                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression, LevelMode, LevelRoundingMode)"
               );
}

Assistant:

void
writeRead (const Array2D<unsigned int> &pi1,
           const Array2D<half> &ph1,
           const Array2D<float> &pf1,
           const char fileName[],
           LineOrder lorder,
           int width,
           int height,
           int xSize,
           int ySize,
           int xOffset,
           int yOffset,
           Compression comp,
           LevelMode mode,
	   LevelRoundingMode rmode)
{
    //
    // Write the pixel data in pi1, ph1 and ph2 to a tiled
    // image file using the specified parameters.
    // Read the pixel data back from the file using the scanline
    // interface one scanline at a time, and verify that the data did
    // not change.
    // For MIPMAP and RIPMAP_LEVELS, the lower levels of the images
    // are filled in cropped versions of the level(0,0) image,
    // i.e. no filtering is done.
    //

    cout << "levelMode " << mode <<
	    ", roundingMode " << rmode <<
            ", line order " << lorder <<
            ",\ntileSize " << xSize << "x" << ySize <<
            ", xOffset " << xOffset <<
            ", yOffset "<< yOffset << endl;

    Header hdr ((Box2i (V2i (0, 0),                     // display window
                        V2i (width - 1, height -1))),
                (Box2i (V2i (xOffset, yOffset),         // data window
                        V2i (xOffset + width - 1, yOffset + height - 1))));
    hdr.lineOrder() = lorder;
    hdr.compression() = comp;

    hdr.channels().insert ("I", Channel (IMF::UINT));
    hdr.channels().insert ("H", Channel (IMF::HALF));
    hdr.channels().insert ("F", Channel (IMF::FLOAT));
    
    hdr.setTileDescription(TileDescription(xSize, ySize, mode, rmode));
    {
        FrameBuffer fb; 

        fb.insert ("I",                                       // name
                   Slice (IMF::UINT,                          // type
                          (char *) &pi1[-yOffset][-xOffset],  // base
                          sizeof (pi1[0][0]),                 // xStride
                          sizeof (pi1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("H",                                       // name
                   Slice (IMF::HALF,                          // type
                          (char *) &ph1[-yOffset][-xOffset],  // base
                          sizeof (ph1[0][0]),                 // xStride
                          sizeof (ph1[0][0]) * width)         // yStride
                  );
                  
        fb.insert ("F",                                       // name
                   Slice (IMF::FLOAT,                              // type
                          (char *) &pf1[-yOffset][-xOffset],  // base
                          sizeof (pf1[0][0]),                 // xStride
                          sizeof (pf1[0][0]) * width)         // yStride
                  );

        cout << " writing" << flush;

        remove (fileName);
        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        
        int startTileY = -1;
	int endTileY = -1;
        int dy;

        switch (mode)
        {
          case ONE_LEVEL:
          {
            if (lorder == DECREASING_Y)
            {
                startTileY = out.numYTiles() - 1;
                endTileY = -1;

                dy = -1;
            }        
            else
            {
                startTileY = 0;
                endTileY = out.numYTiles();

                dy = 1;
            }

            for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                for (int tileX = 0; tileX < out.numXTiles(); ++tileX)         
                    out.writeTile (tileX, tileY);
          }
          break;

          case MIPMAP_LEVELS:
          {
            if (lorder == DECREASING_Y)
            {
                endTileY = -1;
                dy = -1;
            }        
            else
            {
                startTileY = 0;
                dy = 1;
            }

            for (int level = 0; level < out.numLevels(); ++level)
            {
                if (lorder == DECREASING_Y)
                    startTileY = out.numYTiles(level) - 1;
                else
                    endTileY = out.numYTiles(level);

                for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                    for (int tileX = 0; tileX < out.numXTiles(level); ++tileX)
                        out.writeTile (tileX, tileY, level);
            }
          }
          break;
          
          case RIPMAP_LEVELS:
          {
            for (int ylevel = 0; ylevel < out.numYLevels(); ++ylevel)
            {               
                if (lorder == DECREASING_Y)
                {
                    startTileY = out.numYTiles(ylevel) - 1;
                    endTileY = -1;

                    dy = -1;
                }        
                else
                {
                    startTileY = 0;
                    endTileY = out.numYTiles(ylevel);

                    dy = 1;
                }

                for (int xlevel = 0; xlevel < out.numXLevels(); ++xlevel)
                {
                    for (int tileY = startTileY; tileY != endTileY;
                         tileY += dy)
                        for (int tileX = 0; tileX < out.numXTiles (xlevel);
                             ++tileX)
                            out.writeTile (tileX, tileY, xlevel, ylevel);
                }
            }
          }
          break;
			case NUM_LEVELMODES:
			default:
				std::cerr << "Invalid tile mode " << int(mode) << std::endl;
				break;
        }
    }

    {
        cout << " reading INCREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.min.y; y <= dw.max.y; ++y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    {
        cout << endl << "         reading DECREASING_Y" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        FrameBuffer fb;

        fb.insert ("I",                             // name
                   Slice (IMF::UINT,                // type
                          (char *) &pi2[-dwy][-dwx],// base
                          sizeof (pi2[0][0]),       // xStride
                          sizeof (pi2[0][0]) * w)   // yStride
                  );

        fb.insert ("H",                             // name
                   Slice (IMF::HALF,                // type
                          (char *) &ph2[-dwy][-dwx],// base
                          sizeof (ph2[0][0]),       // xStride
                          sizeof (ph2[0][0]) * w)   // yStride
                  );

        fb.insert ("F",                             // name
                   Slice (IMF::FLOAT,               // type
                          (char *) &pf2[-dwy][-dwx],// base
                          sizeof (pf2[0][0]),       // xStride
                          sizeof (pf2[0][0]) * w)   // yStride
                  );

        in.setFrameBuffer (fb);
        for (int y = dw.max.y; y >= dw.min.y; --y)
            in.readPixels (y);

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }
    }

    {
        cout << endl << "         reading INCREASING_Y "
		        "(new frame buffer on every line)" << flush;

        InputFile in (fileName);

        const Box2i &dw = in.header().dataWindow();
        int w = dw.max.x - dw.min.x + 1;
        int h = dw.max.y - dw.min.y + 1;
        int dwx = dw.min.x;
        int dwy = dw.min.y;

        Array2D<unsigned int> pi2 (h, w);
        Array2D<half>         ph2 (h, w);
        Array2D<float>        pf2 (h, w);

        for (int y = dw.min.y; y <= dw.max.y; ++y)
	{
	    FrameBuffer fb;

	    fb.insert ("I",					// name
		       Slice (IMF::UINT,			// type
			      (char *) &pi2[y - dwy][-dwx],	// base
			      sizeof (pi2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("H",					// name
		       Slice (IMF::HALF,			// type
			      (char *) &ph2[y - dwy][-dwx],	// base
			      sizeof (ph2[0][0]),		// xStride
			      0)				// yStride
		      );

	    fb.insert ("F",                     	        // name
		       Slice (IMF::FLOAT,			// type
			      (char *) &pf2[y - dwy][-dwx],	// base
			      sizeof (pf2[0][0]),		// xStride
			      0)				// yStride
		      );

	    in.setFrameBuffer (fb);
            in.readPixels (y);
	}

        cout << " comparing" << flush;

        assert (in.header().displayWindow() == hdr.displayWindow());
        assert (in.header().dataWindow() == hdr.dataWindow());
        assert (in.header().pixelAspectRatio() == hdr.pixelAspectRatio());
        assert (in.header().screenWindowCenter() == hdr.screenWindowCenter());
        assert (in.header().screenWindowWidth() == hdr.screenWindowWidth());
        assert (in.header().lineOrder() == hdr.lineOrder());
        assert (in.header().compression() == hdr.compression());

        ChannelList::ConstIterator hi = hdr.channels().begin();
        ChannelList::ConstIterator ii = in.header().channels().begin();

        while (hi != hdr.channels().end())
        {
            assert (!strcmp (hi.name(), ii.name()));
            assert (hi.channel().type == ii.channel().type);
            assert (hi.channel().xSampling == ii.channel().xSampling);
            assert (hi.channel().ySampling == ii.channel().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header().channels().end());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (pi1[y][x] == pi2[y][x]);
                assert (ph1[y][x] == ph2[y][x]);
                assert (pf1[y][x] == pf2[y][x]);
            }
        }    
    }

    remove (fileName);
    cout << endl;
}